

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int arkSetStopTime(void *arkode_mem,realtype tstop)

{
  char *in_RDI;
  ARKodeMem in_XMM0_Qa;
  ARKodeMem ark_mem;
  int local_4;
  
  if (in_RDI == (char *)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkSetStopTime","arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if ((*(long *)(in_RDI + 0x1d8) < 1) ||
          (0.0 <= ((double)in_XMM0_Qa - *(double *)(in_RDI + 0x198)) * *(double *)(in_RDI + 0x168)))
  {
    *(ARKodeMem *)(in_RDI + 0x158) = in_XMM0_Qa;
    in_RDI[0x150] = '\x01';
    in_RDI[0x151] = '\0';
    in_RDI[0x152] = '\0';
    in_RDI[0x153] = '\0';
    local_4 = 0;
  }
  else {
    arkProcessError(in_XMM0_Qa,*(int *)(in_RDI + 0x198),in_RDI,(char *)0xffffffea,"ARKode",
                    "arkSetStopTime",
                    "The value tstop = %lg is behind current t = %lg in the direction of integration."
                   );
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int arkSetStopTime(void *arkode_mem, realtype tstop)
{
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkSetStopTime", MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;

  /* If ARKode was called at least once, test if tstop is legal
     (i.e. if it was not already passed).
     If arkSetStopTime is called before the first call to ARKode,
     tstop will be checked in ARKode. */
  if (ark_mem->nst > 0) {
    if ( (tstop - ark_mem->tcur) * ark_mem->h < ZERO ) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                      "arkSetStopTime", MSG_ARK_BAD_TSTOP,
                      tstop, ark_mem->tcur);
      return(ARK_ILL_INPUT);
    }
  }

  ark_mem->tstop    = tstop;
  ark_mem->tstopset = SUNTRUE;

  return(ARK_SUCCESS);
}